

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O0

size_t aead_tls_tag_len(EVP_AEAD_CTX *ctx,size_t in_len,size_t extra_in_len)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  size_t pad_len;
  size_t block_size;
  size_t hmac_len;
  AEAD_TLS_CTX *tls_ctx;
  size_t extra_in_len_local;
  size_t in_len_local;
  EVP_AEAD_CTX *ctx_local;
  
  if (extra_in_len != 0) {
    __assert_fail("extra_in_len == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,99,"size_t aead_tls_tag_len(const EVP_AEAD_CTX *, const size_t, const size_t)");
  }
  ctx_local = (EVP_AEAD_CTX *)HMAC_size((HMAC_CTX *)((long)&ctx->state + 0x98));
  uVar1 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)&ctx->state);
  if (uVar1 == 2) {
    uVar2 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)&ctx->state);
    uVar3 = (ulong)uVar2;
    if (uVar3 == 0 || (uVar3 & uVar3 - 1) != 0) {
      __assert_fail("block_size != 0 && (block_size & (block_size - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                    ,0x6f,
                    "size_t aead_tls_tag_len(const EVP_AEAD_CTX *, const size_t, const size_t)");
    }
    ctx_local = (EVP_AEAD_CTX *)
                ((long)ctx_local + (uVar3 - ((long)&ctx_local->aead + in_len) % uVar3));
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t aead_tls_tag_len(const EVP_AEAD_CTX *ctx, const size_t in_len,
                               const size_t extra_in_len) {
  assert(extra_in_len == 0);
  const AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;

  const size_t hmac_len = HMAC_size(&tls_ctx->hmac_ctx);
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) != EVP_CIPH_CBC_MODE) {
    // The NULL cipher.
    return hmac_len;
  }

  const size_t block_size = EVP_CIPHER_CTX_block_size(&tls_ctx->cipher_ctx);
  // An overflow of |in_len + hmac_len| doesn't affect the result mod
  // |block_size|, provided that |block_size| is a smaller power of two.
  assert(block_size != 0 && (block_size & (block_size - 1)) == 0);
  const size_t pad_len = block_size - (in_len + hmac_len) % block_size;
  return hmac_len + pad_len;
}